

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O0

int Wlc_ObjFaninBitNum(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  undefined4 local_28;
  undefined4 local_24;
  int Count;
  int i;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Wlc_ObjFaninId(pObj,local_24);
    p_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjRange(p_00);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Wlc_ObjFaninBitNum( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;
    int i, Count = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Count += Wlc_ObjRange(pFanin);
    return Count;
}